

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintdevice.cpp
# Opt level: O1

void __thiscall
QOpenGLPaintDevicePrivate::QOpenGLPaintDevicePrivate(QOpenGLPaintDevicePrivate *this,QSize *sz)

{
  int iVar1;
  QOpenGLContext *pQVar2;
  
  this->_vptr_QOpenGLPaintDevicePrivate = (_func_int **)&PTR__QOpenGLPaintDevicePrivate_001a1e60;
  this->size = *sz;
  pQVar2 = (QOpenGLContext *)QOpenGLContext::currentContext();
  this->ctx = pQVar2;
  iVar1 = qt_defaultDpiX();
  this->dpmx = ((double)iVar1 * 100.0) / 2.54;
  iVar1 = qt_defaultDpiY();
  this->dpmy = ((double)iVar1 * 100.0) / 2.54;
  this->devicePixelRatio = 1.0;
  this->flipped = false;
  this->engine = (QPaintEngine *)0x0;
  return;
}

Assistant:

QOpenGLPaintDevicePrivate::QOpenGLPaintDevicePrivate(const QSize &sz)
    : size(sz)
    , ctx(QOpenGLContext::currentContext())
    , dpmx(qt_defaultDpiX() * 100. / 2.54)
    , dpmy(qt_defaultDpiY() * 100. / 2.54)
    , devicePixelRatio(1.0)
    , flipped(false)
    , engine(nullptr)
{
}